

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text-buffer.cc
# Opt level: O0

void __thiscall TextBuffer::consolidate_layers(TextBuffer *this)

{
  bool bVar1;
  bool bVar2;
  undefined1 local_30 [7];
  bool needed_by_layer_above;
  vector<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_> mutable_layers;
  Layer *layer;
  TextBuffer *this_local;
  
  mutable_layers.super__Vector_base<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = &this->top_layer->previous_layer;
  std::vector<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_>::vector
            ((vector<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_> *)local_30);
  bVar1 = false;
  for (; mutable_layers.
         super__Vector_base<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage != (pointer)0x0;
      mutable_layers.super__Vector_base<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           &(*mutable_layers.
              super__Vector_base<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage)->previous_layer) {
    if ((bVar1) ||
       (*(int *)(mutable_layers.
                 super__Vector_base<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage + 0x13) != 0)) {
      squash_layers(this,(vector<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_> *)
                         local_30);
      std::vector<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_>::clear
                ((vector<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_> *)local_30);
      bVar1 = true;
    }
    else {
      if ((Layer *)mutable_layers.
                   super__Vector_base<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage == this->base_layer) {
        squash_layers(this,(vector<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_> *)
                           local_30);
        std::vector<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_>::clear
                  ((vector<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_> *)local_30);
      }
      bVar2 = ::optional::operator_cast_to_bool
                        ((optional *)
                         (mutable_layers.
                          super__Vector_base<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 9));
      if (bVar2) {
        *(undefined1 *)
         (mutable_layers.
          super__Vector_base<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage + 0x11) = 0;
      }
      std::vector<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_>::push_back
                ((vector<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_> *)local_30,
                 (value_type *)
                 &mutable_layers.
                  super__Vector_base<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    if (((ulong)mutable_layers.
                super__Vector_base<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage[0x11] & 1) == 0) {
      bVar1 = false;
    }
  }
  squash_layers(this,(vector<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_> *)local_30);
  std::vector<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_>::~vector
            ((vector<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_> *)local_30);
  return;
}

Assistant:

void TextBuffer::consolidate_layers() {
  Layer *layer = top_layer;
  vector<Layer *> mutable_layers;
  bool needed_by_layer_above = false;

  while (layer) {
    if (needed_by_layer_above || layer->snapshot_count > 0) {
      squash_layers(mutable_layers);
      mutable_layers.clear();
      needed_by_layer_above = true;
    } else {
      if (layer == base_layer) {
        squash_layers(mutable_layers);
        mutable_layers.clear();
      }

      if (layer->text) layer->uses_patch = false;
      mutable_layers.push_back(layer);
    }

    if (!layer->uses_patch) needed_by_layer_above = false;
    layer = layer->previous_layer;
  }

  squash_layers(mutable_layers);
}